

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

void __thiscall
QMimeGlobMatchResult::addMatch
          (QMimeGlobMatchResult *this,QString *mimeType,int weight,QString *pattern,
          qsizetype knownSuffixLength)

{
  bool bVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  QString *in_RCX;
  int in_EDX;
  parameter_type in_RDI;
  qsizetype in_R8;
  bool replace;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     in_RCX,(CaseSensitivity)((ulong)in_R8 >> 0x20));
  if (!bVar1) {
    if (in_EDX < *(int *)&in_RDI[2].d.d) {
      QList<QString>::append
                ((QList<QString> *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_RDI);
    }
    else {
      bVar4 = *(int *)&in_RDI[2].d.d < in_EDX;
      if (!(bool)bVar4) {
        qVar2 = QString::size(in_RCX);
        if (qVar2 < (long)in_RDI[2].d.ptr) {
          return;
        }
        qVar2 = QString::size(in_RCX);
        if ((long)in_RDI[2].d.ptr < qVar2) {
          bVar4 = 1;
        }
      }
      if ((bVar4 & 1) != 0) {
        QList<QString>::clear((QList<QString> *)CONCAT17(bVar4,in_stack_ffffffffffffffd0));
        pcVar3 = (char16_t *)QString::size(in_RCX);
        in_RDI[2].d.ptr = pcVar3;
        *(int *)&in_RDI[2].d.d = in_EDX;
      }
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         in_RCX,(CaseSensitivity)((ulong)in_R8 >> 0x20));
      if (!bVar1) {
        QList<QString>::append((QList<QString> *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),in_RDI);
        if ((bVar4 & 1) == 0) {
          QList<QString>::append((QList<QString> *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),in_RDI)
          ;
        }
        else {
          QList<QString>::prepend
                    ((QList<QString> *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),in_RDI);
        }
        in_RDI[2].d.size = in_R8;
      }
    }
  }
  return;
}

Assistant:

void QMimeGlobMatchResult::addMatch(const QString &mimeType, int weight, const QString &pattern,
                                    qsizetype knownSuffixLength)
{
    if (m_allMatchingMimeTypes.contains(mimeType))
        return;
    // Is this a lower-weight pattern than the last match? Skip this match then.
    if (weight < m_weight) {
        m_allMatchingMimeTypes.append(mimeType);
        return;
    }
    bool replace = weight > m_weight;
    if (!replace) {
        // Compare the length of the match
        if (pattern.size() < m_matchingPatternLength)
            return; // too short, ignore
        else if (pattern.size() > m_matchingPatternLength) {
            // longer: clear any previous match (like *.bz2, when pattern is *.tar.bz2)
            replace = true;
        }
    }
    if (replace) {
        m_matchingMimeTypes.clear();
        // remember the new "longer" length
        m_matchingPatternLength = pattern.size();
        m_weight = weight;
    }
    if (!m_matchingMimeTypes.contains(mimeType)) {
        m_matchingMimeTypes.append(mimeType);
        if (replace)
            m_allMatchingMimeTypes.prepend(mimeType); // highest-weight first
        else
            m_allMatchingMimeTypes.append(mimeType);
        m_knownSuffixLength = knownSuffixLength;
    }
}